

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O3

void __thiscall
BtorSimVCDWriter::add_value_change(BtorSimVCDWriter *this,int64_t k,int64_t id,BtorSimState state)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pBVar3;
  int32_t iVar4;
  int iVar5;
  _Base_ptr p_Var6;
  long *plVar7;
  iterator iVar8;
  undefined4 extraout_var;
  BtorSimBitVector *pBVar9;
  undefined8 uVar10;
  size_type *psVar11;
  _Base_ptr p_Var12;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_06;
  _Hash_node_base *p_Var13;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 a;
  pointer pcVar14;
  string sval_1;
  string sval;
  string local_e8;
  string local_c8;
  key_type local_a8;
  BtorSimBitVector *local_88;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 local_80;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_78;
  string local_70;
  string local_50;
  
  a = state.field_1;
  p_Var6 = (this->clocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var6 != (_Base_ptr)0x0) {
    p_Var1 = &(this->clocks)._M_t._M_impl.super__Rb_tree_header;
    p_Var12 = &p_Var1->_M_header;
    do {
      if (id <= *(long *)(p_Var6 + 1)) {
        p_Var12 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[*(long *)(p_Var6 + 1) < id];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var12 != p_Var1) && (*(long *)(p_Var12 + 1) <= id)) {
      return;
    }
  }
  if (state.type == ARRAY) {
    if (a.bv_state == (BtorSimBitVector *)0x0) goto LAB_0010d156;
    pcVar14 = (pointer)(id * 0x10);
    if (*(BtorSimBitVector **)
         (pcVar14 +
         (long)&((this->prev_value).super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                 _M_impl.super__Vector_impl_data._M_start)->field_1) == (BtorSimBitVector *)0x0 ||
        *(BtorSimBitVector **)
         (pcVar14 +
         (long)&((this->prev_value).super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                 _M_impl.super__Vector_impl_data._M_start)->field_1) != a.bv_state) {
      update_time(this,k);
      p_Var13 = ((a.array_state)->data)._M_h._M_before_begin._M_nxt;
      src = extraout_RDX;
      local_80 = a;
      if (p_Var13 != (_Hash_node_base *)0x0) {
        local_78 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->value_changes;
        do {
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,p_Var13[1]._M_nxt,
                     (long)&(p_Var13[1]._M_nxt)->_M_nxt + (long)&(p_Var13[2]._M_nxt)->_M_nxt);
          local_88 = (BtorSimBitVector *)p_Var13[5]._M_nxt;
          if ((*(long *)(pcVar14 +
                        (long)&((this->prev_value).
                                super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                                _M_impl.super__Vector_impl_data._M_start)->field_1) == 0) ||
             (iVar8 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)(*(long *)(pcVar14 +
                                          (long)&((this->prev_value).
                                                  super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 field_1) + 0x20),&local_a8),
             iVar8.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
             ._M_cur == (__node_type *)0x0)) {
LAB_0010cf79:
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
            if (1 < local_88->width) {
              std::__cxx11::string::append((char *)&local_e8);
            }
            btorsim_bv_to_string_abi_cxx11_(&local_c8,local_88);
            std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p);
            }
            if (1 < local_88->width) {
              std::__cxx11::string::append((char *)&local_e8);
            }
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,local_a8._M_dataplus._M_p,
                       local_a8._M_dataplus._M_p + local_a8._M_string_length);
            get_am_identifier(&local_50,this,id,&local_70);
            plVar7 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_50,0,(char *)0x0,
                                        (ulong)local_e8._M_dataplus._M_p);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            psVar11 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_c8.field_2._M_allocated_capacity = *psVar11;
              local_c8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_c8.field_2._M_allocated_capacity = *psVar11;
              local_c8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_c8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            k = (int64_t)&local_c8;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      (local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )k);
            src = extraout_RDX_01;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p);
              src = extraout_RDX_02;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
              src = extraout_RDX_03;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
              src = extraout_RDX_04;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p);
              src = extraout_RDX_05;
            }
          }
          else {
            k = (int64_t)&local_a8;
            iVar8 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)(*(long *)(pcVar14 +
                                        (long)&((this->prev_value).
                                                super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->field_1)
                              + 0x20),(key_type *)k);
            if (iVar8.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
                ._M_cur == (__node_type *)0x0) {
              uVar10 = std::__throw_out_of_range("_Map_base::at");
              if ((_Hash_node_base *)local_e8._M_dataplus._M_p != p_Var13) {
                operator_delete(local_e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p);
              }
              if (local_a8._M_dataplus._M_p != pcVar14) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
              _Unwind_Resume(uVar10);
            }
            src = extraout_RDX_00;
            if (*(BtorSimBitVector **)
                 ((long)iVar8.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
                        ._M_cur + 0x28) != local_88) goto LAB_0010cf79;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
            src = extraout_RDX_06;
          }
          p_Var13 = p_Var13->_M_nxt;
        } while (p_Var13 != (_Hash_node_base *)0x0);
      }
      pBVar3 = (this->prev_value).super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar5 = BtorSimArrayModel::copy(local_80.array_state,(EVP_PKEY_CTX *)k,src);
      BtorSimState::update
                ((BtorSimState *)(pcVar14 + (long)pBVar3),
                 (BtorSimArrayModel *)CONCAT44(extraout_var,iVar5));
    }
  }
  else {
    if (state.type != BITVEC) {
      die("Invalid state");
      return;
    }
    if (a.bv_state == (BtorSimBitVector *)0x0) {
LAB_0010d156:
      msg(1,"No current state for named state %ld!",id);
      return;
    }
    pBVar9 = (this->prev_value).super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
             _M_impl.super__Vector_impl_data._M_start[id].field_1.bv_state;
    if ((pBVar9 == (BtorSimBitVector *)0x0) ||
       (iVar4 = btorsim_bv_compare(a.bv_state,pBVar9), iVar4 != 0)) {
      update_time(this,k);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
      if (1 < (a.bv_state)->width) {
        std::__cxx11::string::append((char *)&local_a8);
      }
      btorsim_bv_to_string_abi_cxx11_(&local_e8,a.bv_state);
      std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_e8._M_dataplus._M_p);
      paVar2 = &local_e8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (1 < (a.bv_state)->width) {
        std::__cxx11::string::append((char *)&local_a8);
      }
      get_bv_identifier_abi_cxx11_(&local_c8,this,id);
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_c8,0,(char *)0x0,(ulong)local_a8._M_dataplus._M_p);
      psVar11 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8.field_2._8_8_ = plVar7[3];
        local_e8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_e8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->value_changes,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      pBVar3 = (this->prev_value).super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pBVar9 = btorsim_bv_copy(a.bv_state);
      BtorSimState::update(pBVar3 + id,pBVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void
BtorSimVCDWriter::add_value_change (int64_t k, int64_t id, BtorSimState state)
{
  if (clocks.find (id) != clocks.end ()) return;
  switch (state.type)
  {
    case BtorSimState::Type::BITVEC: {
      if (!state.bv_state)
      {
        msg (1, "No current state for named state %" PRId64 "!", id);
        return;
      }
      if (!prev_value[id].bv_state
          || btorsim_bv_compare (state.bv_state, prev_value[id].bv_state))
      {
        update_time (k);
        std::string sval ("");
        if (state.bv_state->width > 1) sval += "b";
        sval += btorsim_bv_to_string (state.bv_state);
        if (state.bv_state->width > 1) sval += " ";
        value_changes.push_back (sval + get_bv_identifier (id));
        prev_value[id].update (btorsim_bv_copy (state.bv_state));
      }
    }
    break;
    case BtorSimState::Type::ARRAY: {
      if (!state.array_state)
      {
        msg (1, "No current state for named state %" PRId64 "!", id);
        return;
      }

      if (!prev_value[id].array_state
          || state.array_state != prev_value[id].array_state)
      {
        update_time (k);
        for (auto it : state.array_state->data)
        {
          if (!prev_value[id].array_state
              || prev_value[id].array_state->data.find (it.first)
                     == prev_value[id].array_state->data.end ()
              || prev_value[id].array_state->data.at (it.first) != it.second)
          {
            std::string sval ("");
            if (it.second->width > 1) sval += "b";
            sval += btorsim_bv_to_string (it.second);
            if (it.second->width > 1) sval += " ";
            value_changes.push_back (sval + get_am_identifier (id, it.first));
          }
        }
        prev_value[id].update (state.array_state->copy ());
      }
    }
    break;
    default: die ("Invalid state");
  }
}